

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

_Bool ImGui::IsMouseDragging(ImGuiMouseButton button,float lock_threshold)

{
  bool local_21;
  ImGuiContext_conflict *g;
  float lock_threshold_local;
  ImGuiMouseButton button_local;
  
  local_21 = 4 < (uint)button;
  if (local_21) {
    __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*(g.IO.MouseDown))))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x13c6,"bool ImGui::IsMouseDragging(ImGuiMouseButton, float)");
  }
  if (((GImGui->IO).MouseDown[button] & 1U) == 0) {
    lock_threshold_local._3_1_ = false;
  }
  else {
    lock_threshold_local._3_1_ = IsMouseDragPastThreshold(button,lock_threshold);
  }
  return lock_threshold_local._3_1_;
}

Assistant:

bool ImGui::IsMouseDragging(ImGuiMouseButton button, float lock_threshold)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    if (!g.IO.MouseDown[button])
        return false;
    return IsMouseDragPastThreshold(button, lock_threshold);
}